

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdrTsim3.c
# Opt level: O0

Pdr_Set_t * Txs3_ManTernarySim(Txs3_Man_t *p,int k,Pdr_Set_t *pCube)

{
  Vec_Int_t *pVVar1;
  Gia_Man_t *p_00;
  Pdr_Man_t *p_01;
  Pdr_Set_t *pPVar2;
  uint k_00;
  int iVar3;
  int iVar4;
  int iVar5;
  Aig_Obj_t *pAVar6;
  int *piVar7;
  int *piVar8;
  uint local_104;
  int local_a4;
  int k_1;
  int iLit;
  int i_2;
  Aig_Obj_t *pObj_2;
  int Id;
  int iVar;
  Aig_Obj_t *pObj_1;
  int *piStack_78;
  int i_1;
  int *pCoreLits;
  int local_68;
  int nCoreLits;
  int RetValue;
  int Value;
  int Var;
  int LitAux;
  int Lit;
  int i;
  Vec_Int_t *vLits;
  Vec_Int_t *vVar2Ids;
  Gia_Obj_t *pObj;
  Pdr_Set_t *pRes;
  sat_solver *pSat;
  Pdr_Set_t *pPStack_20;
  int fVerbose;
  Pdr_Set_t *pCube_local;
  Txs3_Man_t *pTStack_10;
  int k_local;
  Txs3_Man_t *p_local;
  
  pSat._4_4_ = 0;
  pPStack_20 = pCube;
  pCube_local._4_4_ = k;
  pTStack_10 = p;
  Vec_IntClear(p->vCoObjs);
  if (pPStack_20 == (Pdr_Set_t *)0x0) {
    vVar2Ids = (Vec_Int_t *)Gia_ManCo(pTStack_10->pGia,pTStack_10->pMan->iOutCur);
    pVVar1 = pTStack_10->vCoObjs;
    iVar3 = Gia_ObjId(pTStack_10->pGia,(Gia_Obj_t *)vVar2Ids);
    Vec_IntPush(pVVar1,iVar3);
  }
  else {
    for (pObj_1._4_4_ = 0; pObj_1._4_4_ < pPStack_20->nLits; pObj_1._4_4_ = pObj_1._4_4_ + 1) {
      if (*(int *)(&pPStack_20->field_0x14 + (long)pObj_1._4_4_ * 4) != -1) {
        p_00 = pTStack_10->pGia;
        iVar3 = Gia_ManPoNum(pTStack_10->pGia);
        iVar4 = Abc_Lit2Var(*(int *)(&pPStack_20->field_0x14 + (long)pObj_1._4_4_ * 4));
        vVar2Ids = (Vec_Int_t *)Gia_ManCo(p_00,iVar3 + iVar4);
        pVVar1 = pTStack_10->vCoObjs;
        iVar3 = Gia_ObjId(pTStack_10->pGia,(Gia_Obj_t *)vVar2Ids);
        Vec_IntPush(pVVar1,iVar3);
      }
    }
  }
  Txs3_ManCollectCone(pTStack_10,pSat._4_4_);
  Pdr_ManCollectValues(pTStack_10->pMan,pCube_local._4_4_,pTStack_10->vCiObjs,pTStack_10->vCiVals);
  Pdr_ManCollectValues(pTStack_10->pMan,pCube_local._4_4_,pTStack_10->vCoObjs,pTStack_10->vCoVals);
  pRes = (Pdr_Set_t *)Pdr_ManFetchSolver(pTStack_10->pMan,pCube_local._4_4_);
  iVar3 = Pdr_ManFreeVar(pTStack_10->pMan,pCube_local._4_4_);
  Value = Abc_Var2Lit(iVar3,0);
  k_00 = pCube_local._4_4_;
  if (pPStack_20 == (Pdr_Set_t *)0x0) {
    _Lit = pTStack_10->pMan->vLits;
    p_01 = pTStack_10->pMan;
    pAVar6 = Aig_ManCo(pTStack_10->pMan->pAig,pTStack_10->pMan->iOutCur);
    iVar3 = Pdr_ObjSatVar(p_01,k_00,2,pAVar6);
    Var = Abc_Var2Lit(iVar3,1);
    Vec_IntFill(_Lit,1,Var);
  }
  else {
    _Lit = Pdr_ManCubeToLits(pTStack_10->pMan,pCube_local._4_4_,pPStack_20,1,1);
  }
  Vec_IntPush(_Lit,Value);
  pPVar2 = pRes;
  piVar7 = Vec_IntArray(_Lit);
  piVar8 = Vec_IntArray(_Lit);
  iVar3 = Vec_IntSize(_Lit);
  local_68 = sat_solver_addclause((sat_solver *)pPVar2,piVar7,piVar8 + iVar3);
  if (local_68 != 1) {
    __assert_fail("RetValue == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/pdr/pdrTsim3.c"
                  ,0xf9,"Pdr_Set_t *Txs3_ManTernarySim(Txs3_Man_t *, int, Pdr_Set_t *)");
  }
  sat_solver_compress((sat_solver *)pRes);
  Vec_IntClear(pTStack_10->vTemp);
  pVVar1 = pTStack_10->vTemp;
  iVar3 = Abc_LitNot(Value);
  Vec_IntPush(pVVar1,iVar3);
  for (LitAux = 0; iVar3 = LitAux, iVar4 = Vec_IntSize(pTStack_10->vCiObjs), iVar3 < iVar4;
      LitAux = LitAux + 1) {
    RetValue = Vec_IntEntry(pTStack_10->vCiObjs,LitAux);
    nCoreLits = Vec_IntEntry(pTStack_10->vCiVals,LitAux);
    pAVar6 = Aig_ManObj(pTStack_10->pMan->pAig,RetValue);
    iVar3 = Pdr_ObjSatVar(pTStack_10->pMan,pCube_local._4_4_,3,pAVar6);
    if (iVar3 < 0) {
      __assert_fail("iVar >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/pdr/pdrTsim3.c"
                    ,0x104,"Pdr_Set_t *Txs3_ManTernarySim(Txs3_Man_t *, int, Pdr_Set_t *)");
    }
    iVar4 = Aig_ObjIsCi(pAVar6);
    if (iVar4 == 0) {
      __assert_fail("Aig_ObjIsCi(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/pdr/pdrTsim3.c"
                    ,0x105,"Pdr_Set_t *Txs3_ManTernarySim(Txs3_Man_t *, int, Pdr_Set_t *)");
    }
    pVVar1 = pTStack_10->vTemp;
    iVar3 = Abc_Var2Lit(iVar3,(uint)((nCoreLits != 0 ^ 0xffU) & 1));
    Vec_IntPush(pVVar1,iVar3);
  }
  if (pSat._4_4_ != 0) {
    if (pPStack_20 == (Pdr_Set_t *)0x0) {
      local_104 = 0;
    }
    else {
      local_104 = pPStack_20->nLits;
    }
    printf("Clause with %d lits on lev %d\n",(ulong)local_104,(ulong)pCube_local._4_4_);
    Vec_IntPrint(pTStack_10->vTemp);
  }
  pPVar2 = pRes;
  piVar7 = Vec_IntArray(pTStack_10->vTemp);
  piVar8 = Vec_IntLimit(pTStack_10->vTemp);
  local_68 = sat_solver_solve((sat_solver *)pPVar2,piVar7,piVar8,0,0,0,0);
  if (local_68 != -1) {
    __assert_fail("RetValue == l_False",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/pdr/pdrTsim3.c"
                  ,0x126,"Pdr_Set_t *Txs3_ManTernarySim(Txs3_Man_t *, int, Pdr_Set_t *)");
  }
  pCoreLits._4_4_ = sat_solver_final((sat_solver *)pRes,&stack0xffffffffffffff88);
  Vec_IntClear(pTStack_10->vTemp);
  for (LitAux = 0; LitAux < pCoreLits._4_4_; LitAux = LitAux + 1) {
    pVVar1 = pTStack_10->vTemp;
    iVar3 = Abc_LitNot(piStack_78[LitAux]);
    Vec_IntPush(pVVar1,iVar3);
  }
  piVar7 = Vec_IntArray(pTStack_10->vTemp);
  iVar3 = Vec_IntSize(pTStack_10->vTemp);
  Vec_IntSelectSort(piVar7,iVar3);
  if (pSat._4_4_ != 0) {
    Vec_IntPrint(pTStack_10->vTemp);
  }
  Vec_IntClear(pTStack_10->vPiLits);
  Vec_IntClear(pTStack_10->vFfLits);
  vLits = (Vec_Int_t *)Vec_PtrGetEntry(&pTStack_10->pMan->vVar2Ids,pCube_local._4_4_);
  for (LitAux = 0; iVar3 = LitAux, iVar4 = Vec_IntSize(pTStack_10->vTemp), iVar3 < iVar4;
      LitAux = LitAux + 1) {
    iVar3 = Vec_IntEntry(pTStack_10->vTemp,LitAux);
    Var = iVar3;
    iVar4 = Abc_LitNot(Value);
    pVVar1 = vLits;
    if (iVar3 != iVar4) {
      iVar3 = Abc_Lit2Var(Var);
      iVar3 = Vec_IntEntry(pVVar1,iVar3);
      pAVar6 = Aig_ManObj(pTStack_10->pMan->pAig,iVar3);
      iVar3 = Aig_ObjIsCi(pAVar6);
      if (iVar3 == 0) {
        __assert_fail("Aig_ObjIsCi(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/pdr/pdrTsim3.c"
                      ,0x13e,"Pdr_Set_t *Txs3_ManTernarySim(Txs3_Man_t *, int, Pdr_Set_t *)");
      }
      iVar3 = Saig_ObjIsPi(pTStack_10->pMan->pAig,pAVar6);
      if (iVar3 == 0) {
        pVVar1 = pTStack_10->vFfLits;
        iVar3 = Aig_ObjCioId(pAVar6);
        iVar4 = Saig_ManPiNum(pTStack_10->pMan->pAig);
        iVar5 = Abc_LitIsCompl(Var);
        iVar3 = Abc_Var2Lit(iVar3 - iVar4,iVar5);
        Vec_IntPush(pVVar1,iVar3);
      }
      else {
        pVVar1 = pTStack_10->vPiLits;
        iVar3 = Aig_ObjCioId(pAVar6);
        iVar4 = Abc_LitIsCompl(Var);
        iVar3 = Abc_Var2Lit(iVar3,iVar4);
        Vec_IntPush(pVVar1,iVar3);
      }
    }
  }
  iVar3 = Vec_IntSize(pTStack_10->vTemp);
  iVar4 = Vec_IntSize(pTStack_10->vPiLits);
  iVar5 = Vec_IntSize(pTStack_10->vFfLits);
  if (iVar3 == iVar4 + iVar5 + 1) {
    if ((pTStack_10->pMan->pPars->fUseAbs != 0) && (pTStack_10->pMan->vAbsFlops != (Vec_Int_t *)0x0)
       ) {
      local_a4 = 0;
      for (k_1 = 0; iVar3 = Vec_IntSize(pTStack_10->vFfLits), k_1 < iVar3; k_1 = k_1 + 1) {
        iVar3 = Vec_IntEntry(pTStack_10->vFfLits,k_1);
        pVVar1 = pTStack_10->pMan->vAbsFlops;
        iVar4 = Abc_Lit2Var(iVar3);
        iVar4 = Vec_IntEntry(pVVar1,iVar4);
        if (iVar4 == 0) {
          pVVar1 = pTStack_10->vPiLits;
          iVar4 = Saig_ManPiNum(pTStack_10->pMan->pAig);
          Vec_IntPush(pVVar1,iVar4 * 2 + iVar3);
        }
        else {
          Vec_IntWriteEntry(pTStack_10->vFfLits,local_a4,iVar3);
          local_a4 = local_a4 + 1;
        }
      }
      Vec_IntShrink(pTStack_10->vFfLits,local_a4);
    }
    if (pSat._4_4_ != 0) {
      Vec_IntPrint(pTStack_10->vPiLits);
    }
    if (pSat._4_4_ != 0) {
      Vec_IntPrint(pTStack_10->vFfLits);
    }
    if (pSat._4_4_ != 0) {
      printf("\n");
    }
    pObj = (Gia_Obj_t *)Pdr_SetCreate(pTStack_10->vFfLits,pTStack_10->vPiLits);
    if ((pCube_local._4_4_ != 0) && (iVar3 = Pdr_SetIsInit((Pdr_Set_t *)pObj,-1), iVar3 != 0)) {
      __assert_fail("k == 0 || !Pdr_SetIsInit(pRes, -1)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/pdr/pdrTsim3.c"
                    ,0x160,"Pdr_Set_t *Txs3_ManTernarySim(Txs3_Man_t *, int, Pdr_Set_t *)");
    }
    return (Pdr_Set_t *)pObj;
  }
  __assert_fail("Vec_IntSize(p->vTemp) == Vec_IntSize(p->vPiLits) + Vec_IntSize(p->vFfLits) + 1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/pdr/pdrTsim3.c"
                ,0x145,"Pdr_Set_t *Txs3_ManTernarySim(Txs3_Man_t *, int, Pdr_Set_t *)");
}

Assistant:

Pdr_Set_t * Txs3_ManTernarySim( Txs3_Man_t * p, int k, Pdr_Set_t * pCube )
{
//    int fTryNew = 1;
//    int fUseLit = 1;
    int fVerbose = 0;
    sat_solver * pSat;
    Pdr_Set_t * pRes;
    Gia_Obj_t * pObj;
    Vec_Int_t * vVar2Ids, * vLits;
    int i, Lit, LitAux, Var, Value, RetValue, nCoreLits, * pCoreLits;//, nLits;
//    if ( k == 0 )
//        fVerbose = 1;
    // collect CO objects
    Vec_IntClear( p->vCoObjs );
    if ( pCube == NULL ) // the target is the property output
    {
        pObj = Gia_ManCo(p->pGia, p->pMan->iOutCur);
        Vec_IntPush( p->vCoObjs, Gia_ObjId(p->pGia, pObj) );
    }
    else // the target is the cube
    {
        int i;
        for ( i = 0; i < pCube->nLits; i++ )
        {
            if ( pCube->Lits[i] == -1 )
                continue;
            pObj = Gia_ManCo(p->pGia, Gia_ManPoNum(p->pGia) + Abc_Lit2Var(pCube->Lits[i]));
            Vec_IntPush( p->vCoObjs, Gia_ObjId(p->pGia, pObj) );
        }
    }
if ( 0 )
{
Abc_Print( 1, "Trying to justify cube " );
if ( pCube )
    Pdr_SetPrint( stdout, pCube, Gia_ManRegNum(p->pGia), NULL );
else
    Abc_Print( 1, "<prop=fail>" );
Abc_Print( 1, " in frame %d.\n", k );
}

    // collect CI objects
    Txs3_ManCollectCone( p, fVerbose );
    // collect values
    Pdr_ManCollectValues( p->pMan, k, p->vCiObjs, p->vCiVals );
    Pdr_ManCollectValues( p->pMan, k, p->vCoObjs, p->vCoVals );

    // read solver
    pSat = Pdr_ManFetchSolver( p->pMan, k );
    LitAux = Abc_Var2Lit( Pdr_ManFreeVar(p->pMan, k), 0 );
    // add the clause (complemented cube) in terms of next state variables
    if ( pCube == NULL ) // the target is the property output
    {
        vLits = p->pMan->vLits;
        Lit = Abc_Var2Lit( Pdr_ObjSatVar(p->pMan, k, 2, Aig_ManCo(p->pMan->pAig, p->pMan->iOutCur)), 1 ); // neg literal (property holds)
        Vec_IntFill( vLits, 1, Lit );
    }
    else
        vLits = Pdr_ManCubeToLits( p->pMan, k, pCube, 1, 1 );
    // add activation literal
    Vec_IntPush( vLits, LitAux );
    RetValue = sat_solver_addclause( pSat, Vec_IntArray(vLits), Vec_IntArray(vLits) + Vec_IntSize(vLits) );
    assert( RetValue == 1 );
    sat_solver_compress( pSat );

    // collect assumptions 
    Vec_IntClear( p->vTemp );
    Vec_IntPush( p->vTemp, Abc_LitNot(LitAux) );
    // iterate through the values of the CI variables
    Vec_IntForEachEntryTwo( p->vCiObjs, p->vCiVals, Var, Value, i )
    {
        Aig_Obj_t * pObj = Aig_ManObj( p->pMan->pAig, Var );
//        iVar = Pdr_ObjSatVar( p->pMan, k, fNext ? 2 - lit_sign(pCube->Lits[i]) : 3, pObj ); assert( iVar >= 0 );
        int iVar = Pdr_ObjSatVar( p->pMan, k, 3, pObj ); assert( iVar >= 0 );
        assert( Aig_ObjIsCi(pObj) );
        Vec_IntPush( p->vTemp, Abc_Var2Lit(iVar, !Value) );
    }
    if ( fVerbose )
    {
        printf( "Clause with %d lits on lev %d\n", pCube ? pCube->nLits : 0, k );
        Vec_IntPrint( p->vTemp );
    }

/*
    // solve with assumptions
//printf( "%d -> ", Vec_IntSize(p->vTemp) );
{
abctime clk = Abc_Clock();
// assume all except flops
    Vec_IntForEachEntryStop( p->vTemp, Lit, i, p->nPiLits + 1 )
        if ( !sat_solver_push(pSat, Lit) )
        {
            assert( 0 );
        }
    nLits = sat_solver_minimize_assumptions( pSat, Vec_IntArray(p->vTemp) + p->nPiLits + 1, Vec_IntSize(p->vTemp) - p->nPiLits - 1, p->pMan->pPars->nConfLimit );
    Vec_IntShrink( p->vTemp, p->nPiLits + 1 + nLits );

p->pMan->tAbs += Abc_Clock() - clk;
    for ( i = 0; i <= p->nPiLits; i++ )
        sat_solver_pop(pSat);
}
//printf( "%d    ", nLits );
*/


    //check one last time
    RetValue = sat_solver_solve( pSat, Vec_IntArray(p->vTemp), Vec_IntLimit(p->vTemp), 0, 0, 0, 0 );
    assert( RetValue == l_False );

    // use analyze final
    nCoreLits = sat_solver_final(pSat, &pCoreLits);
    //assert( Vec_IntSize(p->vTemp) <= nCoreLits );

    Vec_IntClear( p->vTemp );
    for ( i = 0; i < nCoreLits; i++ )
        Vec_IntPush( p->vTemp, Abc_LitNot(pCoreLits[i]) );
    Vec_IntSelectSort( Vec_IntArray(p->vTemp), Vec_IntSize(p->vTemp) );

    if ( fVerbose )
        Vec_IntPrint( p->vTemp );

    // collect the resulting sets
    Vec_IntClear( p->vPiLits );
    Vec_IntClear( p->vFfLits );
    vVar2Ids = (Vec_Int_t *)Vec_PtrGetEntry( &p->pMan->vVar2Ids, k );
    Vec_IntForEachEntry( p->vTemp, Lit, i )
    {
        if ( Lit != Abc_LitNot(LitAux) )
        {
            int Id = Vec_IntEntry( vVar2Ids, Abc_Lit2Var(Lit) );
            Aig_Obj_t * pObj = Aig_ManObj( p->pMan->pAig, Id );
            assert( Aig_ObjIsCi(pObj) );
            if ( Saig_ObjIsPi(p->pMan->pAig, pObj) )
                Vec_IntPush( p->vPiLits, Abc_Var2Lit(Aig_ObjCioId(pObj), Abc_LitIsCompl(Lit)) );
            else
                Vec_IntPush( p->vFfLits, Abc_Var2Lit(Aig_ObjCioId(pObj) - Saig_ManPiNum(p->pMan->pAig), Abc_LitIsCompl(Lit)) );
        }
    }
    assert( Vec_IntSize(p->vTemp) == Vec_IntSize(p->vPiLits) + Vec_IntSize(p->vFfLits) + 1 );

    // move abstracted literals from flops to inputs
    if ( p->pMan->pPars->fUseAbs && p->pMan->vAbsFlops )
    {
        int i, iLit, k = 0;
        Vec_IntForEachEntry( p->vFfLits, iLit, i )
        {
            if ( Vec_IntEntry(p->pMan->vAbsFlops, Abc_Lit2Var(iLit)) ) // used flop
                Vec_IntWriteEntry( p->vFfLits, k++, iLit );
            else
                Vec_IntPush( p->vPiLits, 2*Saig_ManPiNum(p->pMan->pAig) + iLit );
        }
        Vec_IntShrink( p->vFfLits, k );
    }

    if ( fVerbose )
        Vec_IntPrint( p->vPiLits );
    if ( fVerbose )
        Vec_IntPrint( p->vFfLits );
    if ( fVerbose )
        printf( "\n" );

    // derive the final set
    pRes = Pdr_SetCreate( p->vFfLits, p->vPiLits );
    //ZH: Disabled assertion because this invariant doesn't hold with down
    //because of the join operation which can bring in initial states
    assert( k == 0 || !Pdr_SetIsInit(pRes, -1) );
    return pRes;
}